

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<bool> __thiscall
kj::HttpServer::listenHttpImpl(HttpServer *this,AsyncIoStream *connection,bool wantCleanDrain)

{
  int iVar1;
  _func_int **pp_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined7 in_register_00000011;
  ArrayDisposer *pAVar5;
  ArrayDisposer *pAVar6;
  Fault f;
  DebugComparison<kj::HttpService_*,_std::nullptr_t> _kjCondition;
  undefined8 *local_120;
  undefined1 local_118 [16];
  DebugComparison<kj::HttpService_*,_std::nullptr_t> local_108;
  undefined1 local_e0 [80];
  HttpHeaders local_90;
  
  iVar1 = *(int *)&connection[1].super_AsyncOutputStream._vptr_AsyncOutputStream;
  if (iVar1 == 2) {
    pp_Var2 = connection[2].super_AsyncOutputStream._vptr_AsyncOutputStream;
    (**(code **)*pp_Var2)
              (&local_108,pp_Var2,
               (SuspendableHttpServiceFactory *)CONCAT71(in_register_00000011,wantCleanDrain));
    pAVar5 = (ArrayDisposer *)local_108.right;
    pAVar6 = (ArrayDisposer *)local_108.left;
  }
  else if (iVar1 == 1) {
    pAVar5 = (ArrayDisposer *)connection[2].super_AsyncInputStream._vptr_AsyncInputStream;
    pAVar6 = (ArrayDisposer *)&NullDisposer::instance;
  }
  else {
    pAVar5 = (ArrayDisposer *)0x0;
    pAVar6 = (ArrayDisposer *)0x0;
  }
  local_108.right = (uchar *)0x0;
  local_108.op.content.ptr = " != ";
  local_108.op.content.size_ = 5;
  local_108.result = pAVar5 != (ArrayDisposer *)0x0;
  local_108.left = (HttpService *)pAVar5;
  if (local_108.result) {
    local_118._0_8_ = operator_new(0x18);
    *(undefined ***)local_118._0_8_ = &PTR_operator___0061d2e0;
    *(ArrayDisposer **)(local_118._0_8_ + 8) = pAVar6;
    *(ArrayDisposer **)(local_118._0_8_ + 0x10) = pAVar5;
    local_120 = &kj::_::
                 HeapDisposer<kj::Function<kj::Maybe<kj::Own<kj::HttpService,decltype(nullptr)>>(kj::HttpServer::SuspendableRequest&)>::Impl<kj::HttpServer::listenHttpImpl(kj::AsyncIoStream&,bool)::$_0>>
                 ::instance;
    local_e0[0] = '\0';
    listenHttpImpl(this,connection,
                   (SuspendableHttpServiceFactory *)CONCAT71(in_register_00000011,wantCleanDrain),
                   (Maybe<kj::HttpServer::SuspendedRequest> *)&local_120,SUB81(local_e0,0));
    if (local_e0[0] == '\x01') {
      HttpHeaders::~HttpHeaders(&local_90);
      uVar4 = local_e0._16_8_;
      uVar3 = local_e0._8_8_;
      if (local_e0._48_4_ - 1 < 2) {
        local_e0._48_4_ = 0;
      }
      if (local_e0._8_8_ != 0) {
        local_e0._8_8_ = 0;
        local_e0._16_8_ = (HttpHeaderTable *)0x0;
        (**(code **)((ArrayPtr<const_char> *)local_e0._24_8_)->ptr)
                  (local_e0._24_8_,uVar3,1,uVar4,uVar4,0);
      }
    }
    if ((long *)local_118._0_8_ != (long *)0x0) {
      (**(code **)*local_120)
                (local_120,(uchar *)(local_118._0_8_ + *(long *)(*(long *)local_118._0_8_ + -0x10)))
      ;
    }
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<kj::HttpService*,decltype(nullptr)>&>
            ((Fault *)(local_118 + 8),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1fff,FAILED,"srv.get() != nullptr","_kjCondition,",&local_108);
  kj::_::Debug::Fault::fatal((Fault *)(local_118 + 8));
}

Assistant:

kj::Promise<bool> HttpServer::listenHttpImpl(kj::AsyncIoStream& connection, bool wantCleanDrain) {
  kj::Own<HttpService> srv;

  KJ_SWITCH_ONEOF(service) {
    KJ_CASE_ONEOF(ptr, HttpService*) {
      // Fake Own okay because we can assume the HttpService outlives this HttpServer, and we can
      // assume `this` HttpServer outlives the returned `listenHttpCleanDrain()` promise, which will
      // own the fake Own.
      srv = kj::Own<HttpService>(ptr, kj::NullDisposer::instance);
    }
    KJ_CASE_ONEOF(func, HttpServiceFactory) {
      srv = func(connection);
    }
  }

  KJ_ASSERT(srv.get() != nullptr);

  return listenHttpImpl(connection, [srv = kj::mv(srv)](SuspendableRequest&) mutable {
    // This factory function will be owned by the Connection object, meaning the Connection object
    // will own the HttpService. We also know that the Connection object outlives all
    // service.request() promises (service.request() is called from a Connection member function).
    // The Owns we return from this function are attached to the service.request() promises,
    // meaning this factory function will outlive all Owns we return. So, it's safe to return a fake
    // Own.
    return kj::Own<HttpService>(srv.get(), kj::NullDisposer::instance);
  }, kj::none /* suspendedRequest */, wantCleanDrain);
}